

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

void textui_textblock_place(textblock *tb,region orig_area,char *header)

{
  wchar_t x;
  region rVar1;
  undefined1 auVar2 [16];
  wchar_t y;
  int n;
  wchar_t *text;
  uint8_t *attrs;
  size_t local_50;
  size_t n_lines;
  size_t *line_lengths;
  size_t *line_starts;
  region area;
  char *header_local;
  textblock *tb_local;
  region orig_area_local;
  
  area._8_8_ = header;
  _line_starts = region_calculate(orig_area);
  line_lengths = (size_t *)0x0;
  n_lines = 0;
  local_50 = textblock_calculate_lines(tb,&line_lengths,(size_t **)&n_lines,(long)area.col);
  rVar1 = _line_starts;
  if (area._8_8_ != 0) {
    area.row = area.row + -1;
    auVar2 = (undefined1  [16])_line_starts;
    line_starts._0_4_ = rVar1.col;
    x = (wchar_t)line_starts;
    line_starts._4_4_ = rVar1.row;
    y = line_starts._4_4_;
    area.col = rVar1.width;
    n = area.col;
    _line_starts = (region)auVar2;
    Term_erase(x,y,n);
    c_put_str('\x0e',(char *)area._8_8_,line_starts._4_4_,(wchar_t)line_starts);
    line_starts = (size_t *)CONCAT44(line_starts._4_4_ + 1,(wchar_t)line_starts);
  }
  if ((ulong)(long)area.row < local_50) {
    local_50 = (size_t)area.row;
  }
  text = textblock_text(tb);
  attrs = textblock_attrs(tb);
  display_area(text,attrs,line_lengths,(size_t *)n_lines,local_50,_line_starts,0);
  mem_free(line_lengths);
  mem_free((void *)n_lines);
  return;
}

Assistant:

void textui_textblock_place(textblock *tb, region orig_area, const char *header)
{
	/* xxx on resize this should be recalculated */
	region area = region_calculate(orig_area);

	size_t *line_starts = NULL, *line_lengths = NULL;
	size_t n_lines;

	n_lines = textblock_calculate_lines(tb,
			&line_starts, &line_lengths, area.width);

	if (header != NULL) {
		area.page_rows--;
		Term_erase(area.col, area.row, area.width);
		c_put_str(COLOUR_L_BLUE, header, area.row, area.col);
		area.row++;
	}

	if (n_lines > (size_t) area.page_rows)
		n_lines = area.page_rows;

	display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
	             line_lengths, n_lines, area, 0);

	mem_free(line_starts);
	mem_free(line_lengths);
}